

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void SHUFF_OUTPUT_ULONG(bit_io_t *bio,uint64_t n,char len)

{
  ulong *puVar1;
  ulong uVar2;
  uint64_t uVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  
  puVar1 = bio->out_u64;
  iVar4 = (int)CONCAT71(in_register_00000011,len);
  uVar2 = (ulong)iVar4;
  if (uVar2 < bio->buff_btg) {
    *puVar1 = *puVar1 << (uVar2 & 0x3f) | n;
    uVar3 = bio->buff_btg - uVar2;
  }
  else {
    uVar5 = *puVar1 << (bio->buff_btg & 0x3f);
    *puVar1 = uVar5;
    *puVar1 = n >> ((ulong)(uint)(iVar4 - (int)bio->buff_btg) & 0x3f) | uVar5;
    bio->out_u64 = puVar1 + 1;
    puVar1[1] = n;
    uVar3 = (bio->buff_btg - uVar2) + 0x40;
  }
  bio->buff_btg = uVar3;
  return;
}

Assistant:

inline void SHUFF_OUTPUT_ULONG(bit_io_t* bio, uint64_t n, char len)
{
    if (len < bio->buff_btg) {
        *bio->out_u64 <<= len;
        *bio->out_u64 |= n;
        bio->buff_btg -= len;
    } else {
        *bio->out_u64 <<= bio->buff_btg;
        *bio->out_u64 |= (n) >> (len - bio->buff_btg);
        SHUFF_OUTPUT_NEXT(bio);
        *bio->out_u64 = n;
        bio->buff_btg = SHUFF_BUFF_BITS - (len - bio->buff_btg);
    }
}